

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

param * __thiscall mjs::activation_object::find(activation_object *this,wstring_view *s)

{
  gc_heap *h;
  gc_heap *h_00;
  int iVar1;
  gc_vector<mjs::activation_object::param> *pgVar2;
  gc_table *pgVar3;
  gc_table *pgVar4;
  gc_string *pgVar5;
  ulong __n;
  long lVar6;
  param *this_00;
  bool bVar7;
  gc_vector<mjs::activation_object::param> ps;
  undefined8 auStack_40 [2];
  
  if ((this->params_).pos_ == 0) {
LAB_0011f683:
    this_00 = (param *)0x0;
  }
  else {
    h = (this->super_object).heap_;
    pgVar2 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::activation_object::param>,_true>::dereference
                       (&this->params_,h);
    h_00 = pgVar2->heap_;
    auStack_40[0] = *(undefined8 *)&pgVar2->table_;
    pgVar3 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::activation_object::param>::gc_table,_true>::
             dereference((gc_heap_ptr_untracked<mjs::gc_vector<mjs::activation_object::param>::gc_table,_true>
                          *)auStack_40,h_00);
    pgVar4 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::activation_object::param>::gc_table,_true>::
             dereference((gc_heap_ptr_untracked<mjs::gc_vector<mjs::activation_object::param>::gc_table,_true>
                          *)auStack_40,h_00);
    lVar6 = (ulong)pgVar4->length_ * 8 + 8;
    do {
      if (lVar6 + -8 == 0) goto LAB_0011f683;
      this_00 = (param *)((long)&pgVar3->heap_ + lVar6);
      pgVar5 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference
                         ((gc_heap_ptr_untracked<mjs::gc_string,_true> *)this_00,h);
      __n = (ulong)pgVar5->length_;
      if (s->_M_len == __n) {
        if (__n == 0) {
          bVar7 = true;
        }
        else {
          iVar1 = wmemcmp((wchar_t *)(pgVar5 + 1),s->_M_str,__n);
          bVar7 = iVar1 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      lVar6 = lVar6 + -8;
    } while (!bVar7);
  }
  return this_00;
}

Assistant:

value operator()(const object_literal_expression& e) {
        auto o = global_->make_object();
        for (const auto& i : e.elements()) {
            const auto& name = i.name_str();
            const auto prev_attr = o->own_property_attributes(name);
            auto v = get_value(eval(i.value()));
            if (i.type() == property_assignment_type::normal) {
                o->put(string{heap_, name}, v);
            } else {
                // getter/setter
                assert(is_function(v));
                const bool is_get = i.type() == property_assignment_type::get;
                if (!is_valid(prev_attr) || !has_attributes(prev_attr, property_attribute::accessor)) {
                    // Define new property with get or set
                    o->define_accessor_property(string{heap_, name}, make_accessor_object(global_, is_get ? v : value::undefined, !is_get ? v : value::undefined), property_attribute::none);
                } else {
                    // Modifying existing property
                    o->modify_accessor_object(name, v, is_get);
                }
            }
        }
        return value{o};
    }